

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::visitSwitch
          (TGlslangToSpvTraverser *this,TVisit param_1,TIntermSwitch *node)

{
  bool bVar1;
  int iVar2;
  Id selector_00;
  SelectionControlMask control_00;
  TOperator TVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  TType *type;
  undefined4 extraout_var_01;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_00;
  size_type sVar5;
  reference ppTVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TIntermTyped *pTVar7;
  undefined4 extraout_var_07;
  TConstUnionArray *this_01;
  TConstUnion *this_02;
  size_type sVar8;
  reference pvVar9;
  reference ppTVar10;
  uint local_d0;
  value_type local_c9;
  uint s;
  vector<spv::Block_*,_std::allocator<spv::Block_*>_> segmentBlocks;
  int local_a4;
  TIntermNode *local_a0;
  TIntermNode *child;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_90;
  iterator c;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> valueIndexToSegment;
  vector<int,_std::allocator<int>_> caseValues;
  TIntermSequence *sequence;
  vector<TIntermNode_*,_std::allocator<TIntermNode_*>_> codeSegments;
  int defaultSegment;
  SelectionControlMask control;
  Id selector;
  TIntermSwitch *node_local;
  TVisit param_1_local;
  TGlslangToSpvTraverser *this_local;
  
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1d])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar2),this);
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1d])();
  plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x18))();
  type = (TType *)(**(code **)(*plVar4 + 0xf0))();
  selector_00 = accessChainLoad(this,type);
  control_00 = TranslateSwitchControl(this,node);
  codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = -1;
  std::vector<TIntermNode_*,_std::allocator<TIntermNode_*>_>::vector
            ((vector<TIntermNode_*,_std::allocator<TIntermNode_*>_> *)&sequence);
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  this_00 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
            (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 400))();
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &valueIndexToSegment.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(this_00);
  std::allocator<int>::allocator((allocator<int> *)((long)&c._M_current + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_80,sVar5,
             (allocator_type *)((long)&c._M_current + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&c._M_current + 7));
  local_90._M_current =
       (TIntermNode **)
       std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin(this_00);
  while( true ) {
    child = (TIntermNode *)
            std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=
                      (&local_90,
                       (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                        *)&child);
    if (!bVar1) break;
    ppTVar6 = __gnu_cxx::
              __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
              ::operator*(&local_90);
    local_a0 = *ppTVar6;
    iVar2 = (*local_a0->_vptr_TIntermNode[0xd])();
    if (CONCAT44(extraout_var_02,iVar2) == 0) {
LAB_00690233:
      iVar2 = (*local_a0->_vptr_TIntermNode[0xd])();
      if (CONCAT44(extraout_var_04,iVar2) != 0) {
        iVar2 = (*local_a0->_vptr_TIntermNode[0xd])();
        TVar3 = glslang::TIntermBranch::getFlowOp((TIntermBranch *)CONCAT44(extraout_var_05,iVar2));
        if (TVar3 == EOpCase) {
          sVar5 = std::vector<TIntermNode_*,_std::allocator<TIntermNode_*>_>::size
                            ((vector<TIntermNode_*,_std::allocator<TIntermNode_*>_> *)&sequence);
          sVar8 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)
                             &valueIndexToSegment.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_80,sVar8);
          *pvVar9 = (value_type)sVar5;
          iVar2 = (*local_a0->_vptr_TIntermNode[0xd])();
          pTVar7 = glslang::TIntermBranch::getExpression
                             ((TIntermBranch *)CONCAT44(extraout_var_06,iVar2));
          iVar2 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[5])();
          this_01 = glslang::TIntermConstantUnion::getConstArray
                              ((TIntermConstantUnion *)CONCAT44(extraout_var_07,iVar2));
          this_02 = glslang::TConstUnionArray::operator[](this_01,0);
          local_a4 = glslang::TConstUnion::getIConst(this_02);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     &valueIndexToSegment.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_a4);
          goto LAB_006902f6;
        }
      }
      std::vector<TIntermNode_*,_std::allocator<TIntermNode_*>_>::push_back
                ((vector<TIntermNode_*,_std::allocator<TIntermNode_*>_> *)&sequence,&local_a0);
    }
    else {
      iVar2 = (*local_a0->_vptr_TIntermNode[0xd])();
      TVar3 = glslang::TIntermBranch::getFlowOp((TIntermBranch *)CONCAT44(extraout_var_03,iVar2));
      if (TVar3 != EOpDefault) goto LAB_00690233;
      sVar5 = std::vector<TIntermNode_*,_std::allocator<TIntermNode_*>_>::size
                        ((vector<TIntermNode_*,_std::allocator<TIntermNode_*>_> *)&sequence);
      codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar5;
    }
LAB_006902f6:
    __gnu_cxx::
    __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
    ::operator++(&local_90);
  }
  sVar5 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)
                     &valueIndexToSegment.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (sVar5 == 0) {
LAB_0069034d:
    sVar5 = std::vector<TIntermNode_*,_std::allocator<TIntermNode_*>_>::size
                      ((vector<TIntermNode_*,_std::allocator<TIntermNode_*>_> *)&sequence);
    if ((int)sVar5 !=
        codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_) goto LAB_00690376;
  }
  else {
    sVar5 = std::vector<TIntermNode_*,_std::allocator<TIntermNode_*>_>::size
                      ((vector<TIntermNode_*,_std::allocator<TIntermNode_*>_> *)&sequence);
    sVar8 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)
                       &valueIndexToSegment.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_80,sVar8 - 1);
    if ((int)sVar5 != *pvVar9) goto LAB_0069034d;
  }
  segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<TIntermNode_*,_std::allocator<TIntermNode_*>_>::push_back
            ((vector<TIntermNode_*,_std::allocator<TIntermNode_*>_> *)&sequence,
             (value_type *)
             &segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
LAB_00690376:
  std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::vector
            ((vector<spv::Block_*,_std::allocator<spv::Block_*>_> *)&s);
  sVar5 = std::vector<TIntermNode_*,_std::allocator<TIntermNode_*>_>::size
                    ((vector<TIntermNode_*,_std::allocator<TIntermNode_*>_> *)&sequence);
  spv::Builder::makeSwitch
            (&this->builder,selector_00,control_00,(int)sVar5,
             (vector<int,_std::allocator<int>_> *)
             &valueIndexToSegment.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)local_80,
             codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,
             (vector<spv::Block_*,_std::allocator<spv::Block_*>_> *)&s);
  local_c9 = false;
  std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::push(&this->breakForLoop,&local_c9);
  for (local_d0 = 0;
      sVar5 = std::vector<TIntermNode_*,_std::allocator<TIntermNode_*>_>::size
                        ((vector<TIntermNode_*,_std::allocator<TIntermNode_*>_> *)&sequence),
      local_d0 < sVar5; local_d0 = local_d0 + 1) {
    spv::Builder::nextSwitchSegment
              (&this->builder,(vector<spv::Block_*,_std::allocator<spv::Block_*>_> *)&s,local_d0);
    ppTVar10 = std::vector<TIntermNode_*,_std::allocator<TIntermNode_*>_>::operator[]
                         ((vector<TIntermNode_*,_std::allocator<TIntermNode_*>_> *)&sequence,
                          (ulong)local_d0);
    if (*ppTVar10 == (value_type)0x0) {
      spv::Builder::addSwitchBreak(&this->builder,true);
    }
    else {
      ppTVar10 = std::vector<TIntermNode_*,_std::allocator<TIntermNode_*>_>::operator[]
                           ((vector<TIntermNode_*,_std::allocator<TIntermNode_*>_> *)&sequence,
                            (ulong)local_d0);
      (*(*ppTVar10)->_vptr_TIntermNode[2])(*ppTVar10,this);
    }
  }
  std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::pop(&this->breakForLoop);
  spv::Builder::endSwitch(&this->builder,(vector<spv::Block_*,_std::allocator<spv::Block_*>_> *)&s);
  std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::~vector
            ((vector<spv::Block_*,_std::allocator<spv::Block_*>_> *)&s);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &valueIndexToSegment.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<TIntermNode_*,_std::allocator<TIntermNode_*>_>::~vector
            ((vector<TIntermNode_*,_std::allocator<TIntermNode_*>_> *)&sequence);
  return false;
}

Assistant:

bool TGlslangToSpvTraverser::visitSwitch(glslang::TVisit /* visit */, glslang::TIntermSwitch* node)
{
    // emit and get the condition before doing anything with switch
    node->getCondition()->traverse(this);
    spv::Id selector = accessChainLoad(node->getCondition()->getAsTyped()->getType());

    // Selection control:
    const spv::SelectionControlMask control = TranslateSwitchControl(*node);

    // browse the children to sort out code segments
    int defaultSegment = -1;
    std::vector<TIntermNode*> codeSegments;
    glslang::TIntermSequence& sequence = node->getBody()->getSequence();
    std::vector<int> caseValues;
    std::vector<int> valueIndexToSegment(sequence.size());  // note: probably not all are used, it is an overestimate
    for (glslang::TIntermSequence::iterator c = sequence.begin(); c != sequence.end(); ++c) {
        TIntermNode* child = *c;
        if (child->getAsBranchNode() && child->getAsBranchNode()->getFlowOp() == glslang::EOpDefault)
            defaultSegment = (int)codeSegments.size();
        else if (child->getAsBranchNode() && child->getAsBranchNode()->getFlowOp() == glslang::EOpCase) {
            valueIndexToSegment[caseValues.size()] = (int)codeSegments.size();
            caseValues.push_back(child->getAsBranchNode()->getExpression()->getAsConstantUnion()
                ->getConstArray()[0].getIConst());
        } else
            codeSegments.push_back(child);
    }

    // handle the case where the last code segment is missing, due to no code
    // statements between the last case and the end of the switch statement
    if ((caseValues.size() && (int)codeSegments.size() == valueIndexToSegment[caseValues.size() - 1]) ||
        (int)codeSegments.size() == defaultSegment)
        codeSegments.push_back(nullptr);

    // make the switch statement
    std::vector<spv::Block*> segmentBlocks; // returned, as the blocks allocated in the call
    builder.makeSwitch(selector, control, (int)codeSegments.size(), caseValues, valueIndexToSegment, defaultSegment,
        segmentBlocks);

    // emit all the code in the segments
    breakForLoop.push(false);
    for (unsigned int s = 0; s < codeSegments.size(); ++s) {
        builder.nextSwitchSegment(segmentBlocks, s);
        if (codeSegments[s])
            codeSegments[s]->traverse(this);
        else
            builder.addSwitchBreak(true);
    }
    breakForLoop.pop();

    builder.endSwitch(segmentBlocks);

    return false;
}